

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O1

void svc_xprt_shutdown(void)

{
  ushort *puVar1;
  opr_rbtree_node *poVar2;
  ushort uVar3;
  rbtree_x_part *prVar4;
  int iVar5;
  opr_rbtree_node *node;
  long lVar6;
  pthread_rwlock_t *__rwlock;
  ushort uVar7;
  bool bVar8;
  
  if (initialized != '\x01') {
    return;
  }
  lVar6 = 0;
  while( true ) {
    prVar4 = svc_xprt_fd.xt.tree;
    __rwlock = &svc_xprt_fd.xt.tree[lVar6].lock;
    iVar5 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if (iVar5 != 0) break;
    while (node = opr_rbtree_first(&prVar4[lVar6].t), node != (opr_rbtree_node *)0x0) {
      opr_rbtree_remove(&prVar4[lVar6].t,node);
      iVar5 = pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      if (iVar5 != 0) goto LAB_00120af3;
      puVar1 = (ushort *)((long)&node[-0xc].left + 4);
      uVar7 = *(ushort *)((long)&node[-0xc].left + 4);
      do {
        LOCK();
        uVar3 = *puVar1;
        bVar8 = uVar7 == uVar3;
        if (bVar8) {
          *puVar1 = uVar7 | 0x20;
          uVar3 = uVar7;
        }
        uVar7 = uVar3;
        UNLOCK();
      } while (!bVar8);
      if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
        svc_xprt_trace((SVCXPRT *)&node[-0x1a].red,"svc_destroy_it","svc_xprt_shutdown",0x175);
      }
      if ((uVar7 & 0x20) == 0) {
        LOCK();
        poVar2 = node + -0xc;
        iVar5 = *(int *)&poVar2->left;
        *(int *)&poVar2->left = *(int *)&poVar2->left + -1;
        UNLOCK();
        if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
          svc_xprt_trace((SVCXPRT *)&node[-0x1a].red,"svc_release_it","svc_xprt_shutdown",0x175);
        }
        if (iVar5 + -1 < 1) {
          svc_xprt_shutdown_cold_1();
        }
      }
      iVar5 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
      if (iVar5 != 0) goto LAB_00120af3;
    }
    iVar5 = pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    if ((iVar5 != 0) || (iVar5 = pthread_rwlock_destroy((pthread_rwlock_t *)__rwlock), iVar5 != 0))
    break;
    lVar6 = lVar6 + 1;
    if (lVar6 == 0xc1) {
      (*__ntirpc_pkg_params.free_size_)(svc_xprt_fd.xt.tree,0xd920);
      return;
    }
  }
LAB_00120af3:
  abort();
}

Assistant:

void
svc_xprt_shutdown()
{
	struct rbtree_x_part *t;
	struct opr_rbtree_node *n;
	struct rpc_dplx_rec *rec;
	int p_ix;

	if (!initialized)
		return;

	p_ix = 0;
	while (p_ix < SVC_XPRT_PARTITIONS) {
		t = &svc_xprt_fd.xt.tree[p_ix];

		rwlock_wrlock(&t->lock);	/* t WLOCKED */
		while ((n = opr_rbtree_first(&t->t))) {
			rec = opr_containerof(n, struct rpc_dplx_rec, fd_node);

			/* prevent repeats, see svc_xprt_clear() */
			opr_rbtree_remove(&t->t, &rec->fd_node);

			/* fd_node is counted by initial xp_refcnt = 1,
			 * SVC_DESTROY() decrements that reference.
			 */
			rwlock_unlock(&t->lock);
			SVC_DESTROY(&rec->xprt);
			rwlock_wrlock(&t->lock);
		}		/* curr partition */
		rwlock_unlock(&t->lock);	/* t !LOCKED */
		rwlock_destroy(&t->lock);
		p_ix++;
	}			/* SVC_XPRT_PARTITIONS */

	/* free tree */
	mem_free(svc_xprt_fd.xt.tree,
		 SVC_XPRT_PARTITIONS * sizeof(struct rbtree_x_part));
}